

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall Inject::rebind::test_method(rebind *this)

{
  int iVar1;
  ptr_type *ppVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type local_1d0;
  context<0> *local_1c8;
  component<Inject::impl2> y;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  context<0> **local_1a8;
  injected<Inject::service> p2;
  undefined **local_190;
  undefined1 local_188;
  _Base_ptr local_180;
  _Base_ptr local_178;
  injected<Inject::service> p;
  undefined1 local_160 [8];
  _Base_ptr local_158;
  shared_count sStack_150;
  undefined **local_148;
  undefined1 local_140;
  context<0> *local_138;
  element_type *local_130;
  undefined **local_128;
  undefined1 local_120;
  _Base_ptr local_118;
  injected<Inject::service> *local_110;
  context<0> *local_108;
  provides<Inject::service> yy;
  provides<Inject::service> xxx;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::impl1>::component(&xx);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&xxx);
  inject::context<0>::component<Inject::impl2>::component(&y);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::provides(&yy);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)&p);
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0xe1);
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_00163f68;
  local_180 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_178 = (_Base_ptr)0x152778;
  ppVar2 = inject::context<0>::injected<Inject::service>::ptr(&p);
  iVar1 = (**ppVar2->px->_vptr_service)();
  local_1d0._vptr_service = (_func_int **)CONCAT44(extraout_var,iVar1);
  local_1c8 = (context<0> *)inject::id_of<Inject::impl1>::id();
  local_160[0] = (context<0> *)CONCAT44(extraout_var,iVar1) == local_1c8;
  local_1a8 = &local_1c8;
  local_158 = (_Base_ptr)0x0;
  sStack_150.pi_ = (sp_counted_base *)0x0;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e8 = "";
  p2._ptr.px = &local_1d0;
  local_110 = &p2;
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_00163fb8;
  local_118 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_130 = (element_type *)&local_1a8;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_00163fb8;
  local_138 = (context<0> *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_160,&local_190,&local_f0,0xe1,1,2,2,"p->id()",&local_128,"id_of<impl1>::id()",
             &local_148);
  boost::detail::shared_count::~shared_count(&sStack_150);
  inject::context<0>::bind<Inject::service,Inject::impl2,(inject::component_scope)0>(&c);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)&p2);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0xe5);
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_00163f68;
  local_180 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_178 = (_Base_ptr)0x152778;
  ppVar2 = inject::context<0>::injected<Inject::service>::ptr(&p2);
  iVar1 = (**ppVar2->px->_vptr_service)();
  local_1c8 = (context<0> *)CONCAT44(extraout_var_00,iVar1);
  local_108 = (context<0> *)inject::id_of<Inject::impl2>::id();
  local_1d0._vptr_service = (_func_int **)&local_108;
  local_160[0] = (context<0> *)CONCAT44(extraout_var_00,iVar1) == local_108;
  local_158 = (_Base_ptr)0x0;
  sStack_150.pi_ = (sp_counted_base *)0x0;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e8 = "";
  local_1a8 = &local_1c8;
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_00163fb8;
  local_118 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_110 = (injected<Inject::service> *)&local_1a8;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_00163fb8;
  local_138 = (context<0> *)&boost::unit_test::lazy_ostream::inst;
  local_130 = &local_1d0;
  boost::test_tools::tt_detail::report_assertion
            (local_160,&local_190,&local_f0,0xe5,1,2,2,"p2->id()",&local_128,"id_of<impl2>::id()",
             &local_148);
  boost::detail::shared_count::~shared_count(&sStack_150);
  boost::detail::shared_count::~shared_count(&p2._ptr.pn);
  boost::detail::shared_count::~shared_count(&p._ptr.pn);
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  inject::context<0>::head()::_head = c._parent;
  inject::context<0>::current()::_current = c._parent;
  std::
  _Rb_tree<long,_std::pair<const_long,_boost::shared_ptr<void>_>,_std::_Select1st<std::pair<const_long,_boost::shared_ptr<void>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::~_Rb_tree(&c._singletons._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_inject::binding>,_std::_Select1st<std::pair<const_long,_inject::binding>_>,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::~_Rb_tree(&c._bindings._M_t);
  inject::context<0>::component<Inject::impl2>::~component(&y);
  inject::context<0>::component<Inject::impl1>::~component(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rebind)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;
    context<>::component<impl2> y;
    context<>::component<impl2>::provides<service> yy;

    context<> c;
    c.bind<service, impl1>();
    context<>::injected<service> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());
    
    c.bind<service, impl2>();
    context<>::injected<service> p2;
    BOOST_CHECK_EQUAL(p2->id(), id_of<impl2>::id());
}